

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.h
# Opt level: O0

LightRayRecord __thiscall cert::PointLight::visible(PointLight *this,Vec3 *point,Vec3 *normal)

{
  LightRayRecord LVar1;
  Vec3 *v1;
  Vec3 VVar2;
  undefined8 local_c8;
  float local_c0;
  Vec3 local_b8;
  Vec3 local_a8;
  Vec3 local_98;
  Vec3 local_88;
  Vec3 local_78;
  Vec3 local_68;
  float local_58;
  float local_54;
  float lambert;
  float distance;
  float local_48;
  undefined1 local_40 [8];
  Vec3 direction;
  Vec3 *normal_local;
  Vec3 *point_local;
  PointLight *this_local;
  
  unique0x10000130 = normal;
  VVar2 = operator-(&(this->super_Light).position,point);
  local_48 = VVar2.z;
  direction.x = local_48;
  _lambert = VVar2._0_8_;
  local_40._0_4_ = lambert;
  local_40._4_4_ = distance;
  _lambert = VVar2;
  local_54 = Vec3::length((Vec3 *)local_40);
  v1 = stack0xffffffffffffffd0;
  VVar2 = normalize((Vec3 *)local_40);
  local_78.z = VVar2.z;
  local_68.z = local_78.z;
  local_78._0_8_ = VVar2._0_8_;
  local_68.x = local_78.x;
  local_68.y = local_78.y;
  local_78 = VVar2;
  local_58 = dot(v1,&local_68);
  this_local._0_4_ = CONCAT31(this_local._1_3_,0.0 < local_58);
  VVar2 = operator*(&(this->super_Light).color,local_58);
  local_a8.z = VVar2.z;
  local_98.z = local_a8.z;
  local_a8._0_8_ = VVar2._0_8_;
  local_98.x = local_a8.x;
  local_98.y = local_a8.y;
  VVar2 = operator*(&local_98,this->strength);
  local_b8.z = VVar2.z;
  local_88.z = local_b8.z;
  local_b8._0_8_ = VVar2._0_8_;
  local_88.x = local_b8.x;
  local_88.y = local_b8.y;
  VVar2 = operator/(&local_88,local_54 * local_54);
  local_c0 = VVar2.z;
  local_c8 = VVar2._0_8_;
  LVar1.attenuation.x = (float)(undefined4)local_c8;
  LVar1.attenuation.y = (float)local_c8._4_4_;
  LVar1._0_4_ = this_local._0_4_;
  LVar1.attenuation.z = local_c0;
  return LVar1;
}

Assistant:

constexpr LightRayRecord visible (Vec3 const& point, Vec3 const& normal) override
	{
		Vec3 direction = position - point;
		float distance = direction.length ();
		float lambert = dot (normal, normalize (direction));

		return { .visible = lambert > 0.0f, .attenuation = color * lambert * strength / (distance * distance) };
	}